

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O2

bool __thiscall ON_Extrusion::Trim(ON_Extrusion *this,int dir,ON_Interval *domain)

{
  ON_Interval *this_00;
  ON_Interval *this_01;
  double dVar1;
  ON_Curve *pOVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  int iVar6;
  double *pdVar7;
  double dVar8;
  double dVar9;
  ON_Interval dom;
  
  bVar5 = ON_Interval::IsIncreasing(domain);
  if (!bVar5) {
    return false;
  }
  iVar6 = 1 - dir;
  if (this->m_bTransposed == false) {
    iVar6 = dir;
  }
  if (iVar6 == 0) {
    pOVar2 = this->m_profile;
    if (pOVar2 == (ON_Curve *)0x0) {
      return false;
    }
    iVar6 = (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3c])(pOVar2,domain);
    ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
    return (bool)(char)iVar6;
  }
  if (iVar6 != 1) {
    return false;
  }
  this_01 = &this->m_path_domain;
  bVar5 = ON_Interval::IsIncreasing(this_01);
  if (!bVar5) {
    return false;
  }
  bVar5 = ON_Interval::operator!=(this_01,domain);
  if (!bVar5) {
    return true;
  }
  ON_Interval::ON_Interval(&dom);
  ON_Interval::Intersection(&dom,domain,this_01);
  bVar5 = ON_Interval::IsIncreasing(&dom);
  if (!bVar5) {
    return false;
  }
  pdVar7 = ON_Interval::operator[](&dom,0);
  dVar3 = ON_Interval::NormalizedParameterAt(this_01,*pdVar7);
  pdVar7 = ON_Interval::operator[](&dom,1);
  dVar4 = ON_Interval::NormalizedParameterAt(this_01,*pdVar7);
  this_00 = &this->m_t;
  pdVar7 = ON_Interval::operator[](this_00,0);
  dVar8 = *pdVar7;
  pdVar7 = ON_Interval::operator[](this_00,1);
  dVar9 = *pdVar7;
  pdVar7 = ON_Interval::operator[](this_00,0);
  dVar1 = *pdVar7;
  pdVar7 = ON_Interval::operator[](this_00,1);
  if (dVar4 <= dVar3) {
    return false;
  }
  dVar8 = dVar9 * dVar3 + (1.0 - dVar3) * dVar8;
  dVar9 = *pdVar7 * dVar4 + (1.0 - dVar4) * dVar1;
  if (dVar8 < 0.0) {
    return false;
  }
  if (dVar9 <= dVar8) {
    return false;
  }
  if (1.0 < dVar9) {
    return false;
  }
  pdVar7 = ON_Interval::operator[](this_00,0);
  dVar1 = *pdVar7;
  if (dVar1 != dVar8 && 0.0 < dVar8) {
    pdVar7 = ON_Interval::operator[](this_00,0);
    *pdVar7 = dVar8;
    this->m_bHaveN[0] = false;
  }
  pdVar7 = ON_Interval::operator[](this_00,1);
  if (dVar9 < 1.0) {
    if ((dVar9 != *pdVar7) || (NAN(dVar9) || NAN(*pdVar7))) {
      pdVar7 = ON_Interval::operator[](this_00,1);
      *pdVar7 = dVar9;
      this->m_bHaveN[1] = false;
      goto LAB_003f6cd4;
    }
  }
  if (dVar1 == dVar8 || 0.0 >= dVar8) {
    return true;
  }
LAB_003f6cd4:
  this_01->m_t[0] = dom.m_t[0];
  (this->m_path_domain).m_t[1] = dom.m_t[1];
  ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
  return true;
}

Assistant:

bool ON_Extrusion::Trim(
       int dir,
       const ON_Interval& domain
       )
{
  bool rc = false;
  if (!domain.IsIncreasing())
    return false;
  if ( m_bTransposed )
    dir = 1-dir;
  if ( 1 == dir )
  {
    rc = m_path_domain.IsIncreasing();
    if ( rc && m_path_domain != domain )
    {
      ON_Interval dom;
      dom.Intersection(domain,m_path_domain);
      rc = dom.IsIncreasing();
      if (rc)
      {
        double s0 = m_path_domain.NormalizedParameterAt(dom[0]);
        double s1 = m_path_domain.NormalizedParameterAt(dom[1]);
        double t0 = (1.0-s0)*m_t[0] + s0*m_t[1];
        double t1 = (1.0-s1)*m_t[0] + s1*m_t[1];
        rc = (s0 < s1 && 0.0 <= t0 && t0 < t1 && t1 <= 1.0);
        if (rc)
        {
          bool bChanged = false;
          if (t0 != m_t[0] && t0 > 0.0 )
          {
            bChanged = true;
            m_t[0] = t0;
            m_bHaveN[0] = false;
          }
          if ( t1 != m_t[1] && t1 < 1.0 )
          {
            bChanged = true;
            m_t[1] = t1;
            m_bHaveN[1] = false;
          }
          if ( bChanged )
          {
            m_path_domain = dom;
            DestroySurfaceTree();
          }
        }
      }
    }
  }
  else if ( 0 == dir )
  {
    if ( m_profile )
    {
      rc = m_profile->Trim(domain)?true:false;
      DestroySurfaceTree();
    }
  }
  return rc;
}